

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib553.c
# Opt level: O0

size_t myreadfunc(void *ptr,size_t size,size_t nmemb,void *stream)

{
  void *stream_local;
  size_t nmemb_local;
  size_t size_local;
  void *ptr_local;
  
  memset(myreadfunc::buf,0x41,0x400);
  nmemb_local = nmemb * size;
  if (myreadfunc::total < nmemb_local) {
    nmemb_local = myreadfunc::total;
  }
  if (0x400 < nmemb_local) {
    nmemb_local = 0x400;
  }
  memcpy(ptr,myreadfunc::buf,nmemb_local);
  myreadfunc::total = myreadfunc::total - nmemb_local;
  return nmemb_local;
}

Assistant:

static size_t myreadfunc(void *ptr, size_t size, size_t nmemb, void *stream)
{
  static size_t total = POSTLEN;
  static char buf[1024];
  (void)stream;

  memset(buf, 'A', sizeof(buf));

  size *= nmemb;
  if(size > total)
    size = total;

  if(size > sizeof(buf))
    size = sizeof(buf);

  memcpy(ptr, buf, size);
  total -= size;
  return size;
}